

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vec3f * barycentric(vec3f *__return_storage_ptr__,vec2i *pts,vec2i P)

{
  double dVar1;
  double dVar4;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar5;
  int iVar6;
  int iVar8;
  double dVar7;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar6 = (*pts).x;
  iVar8 = (*pts).y;
  dVar5 = (double)(pts[2].x - iVar6);
  dVar1 = (double)(pts[1].x - iVar6);
  dVar4 = (double)(pts[2].y - iVar8);
  dVar11 = (double)(pts[1].y - iVar8);
  dVar10 = dVar5 * dVar11 - dVar4 * dVar1;
  if (1.0 <= ABS(dVar10)) {
    dVar7 = (double)(iVar6 - P.x);
    dVar9 = (double)(iVar8 - P.y);
    auVar2._0_8_ = dVar4 * dVar7 - dVar9 * dVar5;
    auVar2._8_8_ = dVar1 * dVar9 - dVar11 * dVar7;
    dVar1 = 1.0 - (auVar2._8_8_ + auVar2._0_8_) / dVar10;
    auVar3._8_8_ = dVar10;
    auVar3._0_8_ = dVar10;
    auVar3 = divpd(auVar2,auVar3);
  }
  else {
    dVar1 = -1.0;
    auVar3 = _DAT_00105020;
  }
  __return_storage_ptr__->x = dVar1;
  __return_storage_ptr__->y = (double)auVar3._0_8_;
  __return_storage_ptr__->z = (double)auVar3._8_8_;
  return __return_storage_ptr__;
}

Assistant:

vec3f barycentric(vec2i *pts, vec2i P)
{
    vec3f u = cross(vec3f(pts[2][0] - pts[0][0], pts[1][0] - pts[0][0], pts[0][0] - P[0]),
                    vec3f(pts[2][1] - pts[0][1], pts[1][1] - pts[0][1], pts[0][1] - P[1]));
    /* `pts` and `P` has integer value as coordinates
       so `abs(u[2])` < 1 means `u[2]` is 0, that means triangle is degenerate
       in this case return something with negative coordinates */
    if (std::abs(u[2]) < 1) return vec3f(-1, 1, 1);
    return vec3f(1.f - (u.x + u.y) / u.z, u.y / u.z, u.x / u.z);
}